

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntPushUniqueOrderCost(Vec_Int_t *p,int Entry,Vec_Int_t *vCost)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = p->nSize;
  uVar5 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  while (uVar5 != uVar7) {
    piVar4 = p->pArray + uVar7;
    uVar7 = uVar7 + 1;
    if (*piVar4 == Entry) {
      return uVar1;
    }
  }
  if (uVar1 == p->nCap) {
    iVar2 = 0x10;
    if (0xf < (int)uVar1) {
      iVar2 = uVar1 * 2;
    }
    Vec_IntGrow(p,iVar2);
    uVar1 = p->nSize;
  }
  p->nSize = uVar1 + 1;
  piVar4 = p->pArray;
  for (uVar7 = (ulong)uVar1; uVar6 = (int)uVar1 >> 0x1f & uVar1, 0 < (int)(uint)uVar7;
      uVar7 = uVar7 - 1) {
    iVar2 = Vec_IntEntry(vCost,piVar4[uVar7 - 1]);
    iVar3 = Vec_IntEntry(vCost,Entry);
    piVar4 = p->pArray;
    uVar6 = (uint)uVar7;
    if (iVar2 <= iVar3) break;
    piVar4[uVar7] = piVar4[uVar7 - 1];
  }
  piVar4[(int)uVar6] = Entry;
  return uVar6;
}

Assistant:

static inline int Vec_IntPushUniqueOrderCost( Vec_Int_t * p, int Entry, Vec_Int_t * vCost )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_IntPushOrderCost( p, Entry, vCost );
    return 0;
}